

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query.c
# Opt level: O0

void query_initials(char *first_name,char *last_name)

{
  int iVar1;
  char *pcVar2;
  char local_418;
  char local_417;
  char str [1024];
  char *last_name_local;
  char *first_name_local;
  
  str._1016_8_ = last_name;
  while( true ) {
    do {
      printf("What are their initials? ");
      pcVar2 = fgets(&local_418,0x400,_stdin);
      if (pcVar2 == (char *)0x0) {
        exit(1);
      }
    } while (local_418 == '\n');
    iVar1 = toupper((int)local_418);
    if ((((0x40 < iVar1) && (iVar1 = toupper((int)local_418), iVar1 < 0x5b)) &&
        (iVar1 = toupper((int)local_417), 0x40 < iVar1)) &&
       (iVar1 = toupper((int)local_417), iVar1 < 0x5b)) break;
    printf("Invalid initials!\n");
  }
  iVar1 = toupper((int)local_418);
  *first_name = (char)iVar1;
  iVar1 = toupper((int)local_417);
  *(char *)str._1016_8_ = (char)iVar1;
  return;
}

Assistant:

void query_initials(char* first_name, char* last_name) {
  while (true) {
    char str[1024];
    printf("What are their initials? ");
    if (!fgets(str, 1024, stdin)) exit(1);
    if (str[0] == '\n') continue;
    if (
      toupper(str[0]) < 'A' || toupper(str[0]) > 'Z'
      || toupper(str[1]) < 'A' || toupper(str[1]) > 'Z'
    ) {
      printf("Invalid initials!\n");
    } else {
      *first_name = (char)toupper(str[0]);
      *last_name = (char)toupper(str[1]);
      return;
    }
  }
}